

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Scene::render_in_opengl(Scene *this)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    plVar2 = *(long **)(p_Var3 + 1);
    if (((char)plVar2[0x1d] == '\x01') && (*(char *)((long)plVar2 + 0xe9) == '\0')) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  for (p_Var3 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    plVar2 = *(long **)(p_Var3 + 1);
    if (((char)plVar2[0x1d] == '\x01') && (*(char *)((long)plVar2 + 0xe9) == '\x01')) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  return;
}

Assistant:

void Scene::render_in_opengl()
{
   for (SceneObject *obj : objects)
   {
      if( obj->isVisible && !obj->isGhosted )
      {
         obj->draw();
      }
   }

   for (SceneObject *obj : objects)
   {
      if( obj->isVisible && obj->isGhosted )
      {
         obj->drawGhost();
      }
   }
}